

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

void __thiscall wabt::LoadStoreTracking::Track(LoadStoreTracking *this,Node *n)

{
  uint uVar1;
  Opcode OVar2;
  Address AVar3;
  bool bVar4;
  Type TVar5;
  reference n_00;
  LoadStoreExpr<(wabt::ExprType)21> *pLVar6;
  LoadStoreExpr<(wabt::ExprType)44> *pLVar7;
  const_reference pvVar8;
  LoadStoreExpr<(wabt::ExprType)44> *se;
  LoadStoreExpr<(wabt::ExprType)21> *le;
  Node *c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Node,_std::allocator<wabt::Node>_> *__range2;
  Node *n_local;
  LoadStoreTracking *this_local;
  
  __end2 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::begin(&n->children);
  c = (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&n->children);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                                     *)&c), bVar4) {
    n_00 = __gnu_cxx::
           __normal_iterator<const_wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
           ::operator*(&__end2);
    Track(this,n_00);
    __gnu_cxx::
    __normal_iterator<const_wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>::
    operator++(&__end2);
  }
  if (n->etype == Load) {
    pLVar6 = cast<wabt::LoadStoreExpr<(wabt::ExprType)21>,wabt::Expr>(n->e);
    uVar1 = pLVar6->offset;
    OVar2.enum_ = (pLVar6->opcode).enum_;
    TVar5 = Opcode::GetResultType(&pLVar6->opcode);
    AVar3 = pLVar6->align;
    pvVar8 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[](&n->children,0);
    LoadStore(this,(ulong)uVar1,OVar2,TVar5,AVar3,pvVar8);
  }
  else if (n->etype == Store) {
    pLVar7 = cast<wabt::LoadStoreExpr<(wabt::ExprType)44>,wabt::Expr>(n->e);
    uVar1 = pLVar7->offset;
    OVar2.enum_ = (pLVar7->opcode).enum_;
    TVar5 = Opcode::GetParamType2(&pLVar7->opcode);
    AVar3 = pLVar7->align;
    pvVar8 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[](&n->children,0);
    LoadStore(this,(ulong)uVar1,OVar2,TVar5,AVar3,pvVar8);
  }
  return;
}

Assistant:

void Track(const Node& n) {
    for (auto& c : n.children) Track(c);
    switch (n.etype) {
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(le.offset, le.opcode, le.opcode.GetResultType(),
                  le.align, n.children[0]);
        break;
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(se.offset, se.opcode, se.opcode.GetParamType2(),
                  se.align, n.children[0]);
        break;
      }
      default:
        break;
    }
  }